

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

bool __thiscall
testing::internal::TypedExpectation<void_(void_*,_unsigned_long)>::Matches
          (TypedExpectation<void_(void_*,_unsigned_long)> *this,ArgumentTuple *args)

{
  bool bVar1;
  MatchResultListener local_20;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<void*>,testing::Matcher<unsigned_long>>,std::tuple<void*,unsigned_long>>
                    (&this->matchers_,args);
  if (bVar1) {
    local_20.stream_ = (ostream *)0x0;
    local_20._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_00269a30;
    bVar1 = MatcherBase<const_std::tuple<void_*,_unsigned_long>_&>::MatchAndExplain
                      (&(this->extra_matcher_).
                        super_MatcherBase<const_std::tuple<void_*,_unsigned_long>_&>,args,&local_20)
    ;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }